

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_util.c
# Opt level: O1

lzma_vli lzma_block_unpadded_size(lzma_block *block)

{
  uint uVar1;
  lzma_check type;
  lzma_vli lVar2;
  uint32_t uVar3;
  ulong uVar4;
  
  if ((block != (lzma_block *)0x0) && (block->version < 2)) {
    uVar1 = block->header_size;
    if (((uVar1 & 3) == 0 && uVar1 - 8 < 0x3f9) &&
       (lVar2 = block->compressed_size, lVar2 != 0 && -2 < (long)lVar2)) {
      type = block->check;
      if (type >= 0x10 || lVar2 == 0xffffffffffffffff) {
        return -(ulong)(type < 0x10);
      }
      uVar3 = lzma_check_size(type);
      uVar4 = (ulong)uVar3 + lVar2 + uVar1;
      if (4 < uVar4) {
        if (0x7ffffffffffffffc < uVar4) {
          return 0;
        }
        return uVar4;
      }
      __assert_fail("unpadded_size >= UNPADDED_SIZE_MIN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/block_util.c"
                    ,0x49,"lzma_vli lzma_block_unpadded_size(const lzma_block *)");
    }
  }
  return 0;
}

Assistant:

extern LZMA_API(lzma_vli)
lzma_block_unpadded_size(const lzma_block *block)
{
	// Validate the values that we are interested in i.e. all but
	// Uncompressed Size and the filters.
	//
	// NOTE: This function is used for validation too, so it is
	// essential that these checks are always done even if
	// Compressed Size is unknown.
	if (block == NULL || block->version > 1
			|| block->header_size < LZMA_BLOCK_HEADER_SIZE_MIN
			|| block->header_size > LZMA_BLOCK_HEADER_SIZE_MAX
			|| (block->header_size & 3)
			|| !lzma_vli_is_valid(block->compressed_size)
			|| block->compressed_size == 0
			|| (unsigned int)(block->check) > LZMA_CHECK_ID_MAX)
		return 0;

	// If Compressed Size is unknown, return that we cannot know
	// size of the Block either.
	if (block->compressed_size == LZMA_VLI_UNKNOWN)
		return LZMA_VLI_UNKNOWN;

	// Calculate Unpadded Size and validate it.
	const lzma_vli unpadded_size = block->compressed_size
				+ block->header_size
				+ lzma_check_size(block->check);

	assert(unpadded_size >= UNPADDED_SIZE_MIN);
	if (unpadded_size > UNPADDED_SIZE_MAX)
		return 0;

	return unpadded_size;
}